

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

node * list_insert_before(list *list,node *node,void *data)

{
  node *pnVar1;
  
  pnVar1 = node_create(data);
  pnVar1 = list_insert_node_before(list,node,pnVar1);
  return pnVar1;
}

Assistant:

struct node *list_insert_before(struct list *list, struct node *node, const void *data)
{
        return list_insert_node_before(list, node, node_create(data));
}